

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaSAXHandleText(void *ctx,xmlChar *ch,int len)

{
  uint uVar1;
  int iVar2;
  xmlChar *str2;
  int *in_R9;
  
  if ((-1 < *(int *)((long)ctx + 0xac)) &&
     (*(int *)((long)ctx + 0x130) == -1 || *(int *)((long)ctx + 0xac) < *(int *)((long)ctx + 0x130))
     ) {
    uVar1 = *(uint *)(*(long *)((long)ctx + 0xc0) + 0x40);
    if ((uVar1 & 0x20) != 0) {
      *(uint *)(*(long *)((long)ctx + 0xc0) + 0x40) = uVar1 & 0xffffffdf;
    }
    str2 = (xmlChar *)0x3;
    iVar2 = xmlSchemaVPushText((xmlSchemaValidCtxtPtr)ctx,3,ch,len,3,in_R9);
    if (iVar2 == -1) {
      xmlSchemaInternalErr2
                ((xmlSchemaAbstractCtxtPtr)ctx,"xmlSchemaSAXHandleCDataSection",
                 "calling xmlSchemaVPushText()",(xmlChar *)0x0,str2);
      *(undefined4 *)((long)ctx + 0x68) = 0xffffffff;
      xmlStopParser(*(xmlParserCtxtPtr *)((long)ctx + 0x50));
      return;
    }
  }
  return;
}

Assistant:

static void
xmlSchemaSAXHandleText(void *ctx,
		       const xmlChar * ch,
		       int len)
{
    xmlSchemaValidCtxtPtr vctxt = (xmlSchemaValidCtxtPtr) ctx;

    if (vctxt->depth < 0)
	return;
    if ((vctxt->skipDepth != -1) && (vctxt->depth >= vctxt->skipDepth))
	return;
    if (vctxt->inode->flags & XML_SCHEMA_ELEM_INFO_EMPTY)
	vctxt->inode->flags ^= XML_SCHEMA_ELEM_INFO_EMPTY;
    if (xmlSchemaVPushText(vctxt, XML_TEXT_NODE, ch, len,
	XML_SCHEMA_PUSH_TEXT_VOLATILE, NULL) == -1) {
	VERROR_INT("xmlSchemaSAXHandleCDataSection",
	    "calling xmlSchemaVPushText()");
	vctxt->err = -1;
	xmlStopParser(vctxt->parserCtxt);
    }
}